

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerHeuristic.cpp
# Opt level: O0

void __thiscall Memory::RecyclerHeuristic::RecyclerHeuristic(RecyclerHeuristic *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  uint local_64;
  uint baseFactor;
  DWORDLONG physicalMemoryBytes;
  undefined1 local_50 [4];
  BOOL isSuccess;
  MEMORYSTATUSEX mem;
  RecyclerHeuristic *this_local;
  
  local_50 = (undefined1  [4])0x40;
  mem.ullAvailExtendedVirtual = (DWORDLONG)this;
  BVar3 = GlobalMemoryStatusEx((LPMEMORYSTATUSEX)local_50);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerHeuristic.cpp"
                       ,0x1e,"(isSuccess)","isSuccess");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (((BVar3 == 0) || (bVar2 = AutoSystemInfo::IsLowMemoryDevice(), !bVar2)) ||
     (0x20000000 < (ulong)mem._0_8_)) {
    if ((BVar3 == 0) || (0x40000000 < (ulong)mem._0_8_)) {
      local_64 = 0xc0;
      this->DefaultMaxFreePageCount = 0x20000;
      this->DefaultMaxAllocPageCount = 0x100;
    }
    else {
      local_64 = 0x40;
      this->DefaultMaxFreePageCount = 0x4000;
      this->DefaultMaxAllocPageCount = 0x40;
    }
  }
  else {
    local_64 = 0x10;
    this->DefaultMaxFreePageCount = 0x1000;
    this->DefaultMaxAllocPageCount = 0x20;
  }
  ConfigureBaseFactor(this,local_64);
  return;
}

Assistant:

RecyclerHeuristic::RecyclerHeuristic()
{
    ::MEMORYSTATUSEX mem;
    mem.dwLength = sizeof(mem);
    BOOL isSuccess = ::GlobalMemoryStatusEx(&mem);
    Assert(isSuccess);

    DWORDLONG physicalMemoryBytes = mem.ullTotalPhys;
    uint baseFactor;

    // xplat-todo: Android sysconf is rather unreliable,
    // ullTotalPhys may not be the best source for a decision below
    if (isSuccess && AutoSystemInfo::IsLowMemoryDevice() && physicalMemoryBytes <= 512 MEGABYTES)
    {
        // Low-end Apollo (512MB RAM) scenario.
        // Note that what's specific about Apollo is that IE runs in physical memory,
        //      that's one reason to distinguish 512MB Apollo from 512MB desktop.
        baseFactor = 16;
        this->DefaultMaxFreePageCount = 16 MEGABYTES_OF_PAGES;
        this->DefaultMaxAllocPageCount = 32;
    }
    else if (isSuccess && physicalMemoryBytes <= 1024 MEGABYTES)
    {
        // Tablet/slate/high-end Apollo scenario, including 512MB non-Apollo.
        baseFactor = 64;
        this->DefaultMaxFreePageCount = 64 MEGABYTES_OF_PAGES;
        this->DefaultMaxAllocPageCount = 64;
    }
    else
    {
        // Regular desktop scenario.
        baseFactor = 192;
        this->DefaultMaxFreePageCount = 512 MEGABYTES_OF_PAGES;
        this->DefaultMaxAllocPageCount = 256;
    }

    this->ConfigureBaseFactor(baseFactor);
}